

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall
ON_SubDMeshFragmentIterator::TotalPointCount(ON_SubDMeshFragmentIterator *this,uint mesh_density)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint half_size_fragment_count;
  uint full_size_fragment_count;
  
  uVar1 = ClampMeshDensity(this,mesh_density);
  _half_size_fragment_count = 0;
  GetFragmentCounts(this,&full_size_fragment_count,&half_size_fragment_count);
  iVar3 = (1 << ((byte)uVar1 & 0x1f)) + 1;
  iVar3 = iVar3 * iVar3;
  if (6 < uVar1) {
    iVar3 = 0;
  }
  iVar2 = (1 << ((byte)(uVar1 - 1) & 0x1f)) + 1;
  iVar2 = iVar2 * iVar2;
  if (5 < uVar1 - 1) {
    iVar2 = 0;
  }
  return iVar2 * half_size_fragment_count + iVar3 * full_size_fragment_count;
}

Assistant:

unsigned int ON_SubDMeshFragmentIterator::TotalPointCount(
  unsigned int mesh_density
  ) const
{
  mesh_density = ClampMeshDensity(mesh_density);
  unsigned int full_size_fragment_count = 0;
  unsigned int half_size_fragment_count = 0;
  ON_SubDMeshFragmentIterator::GetFragmentCounts(full_size_fragment_count, half_size_fragment_count);
  // const unsigned int grid_side_count = 1 << mesh_density;
  const unsigned int full_size_point_count = ON_SubDMeshFragment::FullFragmentMeshPointCountFromDensity(mesh_density);
  const unsigned int half_size_point_count = ON_SubDMeshFragment::HalfFragmentMeshPointCountFromDensity(mesh_density);
  return full_size_fragment_count * full_size_point_count + half_size_fragment_count * half_size_point_count;
}